

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS
ref_geom_bspline_span_index
          (REF_INT degree,REF_INT n_control_point,REF_DBL *knots,REF_DBL t,REF_INT *span)

{
  int iVar1;
  int iVar2;
  REF_INT RVar3;
  int iVar4;
  
  if (knots[n_control_point] <= t) {
    degree = n_control_point + -1;
  }
  else if (knots[degree] < t) {
    iVar4 = n_control_point + degree;
    RVar3 = degree;
    while( true ) {
      degree = iVar4 / 2;
      iVar1 = RVar3;
      iVar2 = degree;
      if (((knots[degree] <= t) &&
          (iVar1 = degree, iVar2 = n_control_point, t < knots[(long)degree + 1])) ||
         (RVar3 == n_control_point)) break;
      iVar4 = iVar1 + iVar2;
      RVar3 = iVar1;
      n_control_point = iVar2;
    }
  }
  *span = degree;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bspline_span_index(REF_INT degree,
                                               REF_INT n_control_point,
                                               REF_DBL *knots, REF_DBL t,
                                               REF_INT *span) {
  REF_INT low, high, mid;
  REF_INT n = ref_geom_bspline_n(degree, n_control_point);
  *span = REF_EMPTY;
  if (t >= knots[n + 1]) {
    *span = n;
    return REF_SUCCESS;
  }
  if (t <= knots[degree]) {
    *span = degree;
    return REF_SUCCESS;
  }
  low = degree;
  high = n + 1;
  mid = (low + high) / 2;
  while ((t < knots[mid] || t >= knots[mid + 1]) && (low != high)) {
    /* printf("t %f l %d m %d h %d\n",t,low,mid,high); */
    if (t < knots[mid]) {
      high = mid;
    } else {
      low = mid;
    }
    mid = (low + high) / 2;
  }
  *span = mid;
  return REF_SUCCESS;
}